

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O0

void __thiscall
Storage::Disk::PCMTrack::PCMTrack
          (PCMTrack *this,
          vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *segments)

{
  Time TVar1;
  bool bVar2;
  reference pPVar3;
  size_type sVar4;
  undefined1 local_e0 [8];
  PCMSegment length_adjusted_segment;
  Time proportion_of_whole;
  Time original_length_of_segment;
  PCMSegment *segment_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *__range1_1;
  reference local_50;
  PCMSegment *segment;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *__range1;
  Time local_20;
  Time total_length;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *segments_local;
  PCMTrack *this_local;
  
  total_length = (Time)segments;
  PCMTrack(this);
  Time::Time(&local_20);
  TVar1 = total_length;
  __end1 = std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::begin
                     ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                       *)total_length);
  segment = (PCMSegment *)
            std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::end
                      ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                        *)TVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Storage::Disk::PCMSegment_*,_std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>_>
                                *)&segment);
    if (!bVar2) break;
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_Storage::Disk::PCMSegment_*,_std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>_>
             ::operator*(&__end1);
    local_50 = pPVar3;
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size(&pPVar3->data);
    __range1_1 = (vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
                 Time::operator*(&pPVar3->length_of_a_bit,(uint)sVar4);
    Time::operator+=(&local_20,(Time *)&__range1_1);
    __gnu_cxx::
    __normal_iterator<const_Storage::Disk::PCMSegment_*,_std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>_>
    ::operator++(&__end1);
  }
  Time::simplify(&local_20);
  TVar1 = total_length;
  __end1_1 = std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
             begin((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
                   total_length);
  segment_1 = (PCMSegment *)
              std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
              end((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
                  TVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_Storage::Disk::PCMSegment_*,_std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>_>
                        *)&segment_1);
    if (!bVar2) break;
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_Storage::Disk::PCMSegment_*,_std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>_>
             ::operator*(&__end1_1);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size(&pPVar3->data);
    proportion_of_whole = Time::operator*(&pPVar3->length_of_a_bit,(uint)sVar4);
    length_adjusted_segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage =
         (_Bit_pointer)Time::operator/(&proportion_of_whole,&local_20);
    Time::simplify((Time *)&length_adjusted_segment.fuzzy_mask.
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage);
    PCMSegment::PCMSegment((PCMSegment *)local_e0,pPVar3);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size(&pPVar3->data);
    local_e0 = (undefined1  [8])
               Time::operator/((Time *)&length_adjusted_segment.fuzzy_mask.
                                        super__Bvector_base<std::allocator<bool>_>._M_impl.
                                        super__Bvector_impl_data._M_end_of_storage,(uint)sVar4);
    Time::simplify((Time *)local_e0);
    std::
    vector<Storage::Disk::PCMSegmentEventSource,std::allocator<Storage::Disk::PCMSegmentEventSource>>
    ::emplace_back<Storage::Disk::PCMSegment&>
              ((vector<Storage::Disk::PCMSegmentEventSource,std::allocator<Storage::Disk::PCMSegmentEventSource>>
                *)&this->segment_event_sources_,(PCMSegment *)local_e0);
    PCMSegment::~PCMSegment((PCMSegment *)local_e0);
    __gnu_cxx::
    __normal_iterator<const_Storage::Disk::PCMSegment_*,_std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

PCMTrack::PCMTrack(const std::vector<PCMSegment> &segments) : PCMTrack() {
	// sum total length of all segments
	Time total_length;
	for(const auto &segment : segments) {
		total_length += segment.length_of_a_bit * unsigned(segment.data.size());
	}
	total_length.simplify();

	// each segment is then some proportion of the total; for them all to sum to 1 they'll
	// need to be adjusted to be
	for(const auto &segment : segments) {
		Time original_length_of_segment = segment.length_of_a_bit * unsigned(segment.data.size());
		Time proportion_of_whole = original_length_of_segment / total_length;
		proportion_of_whole.simplify();
		PCMSegment length_adjusted_segment = segment;
		length_adjusted_segment.length_of_a_bit = proportion_of_whole / unsigned(segment.data.size());
		length_adjusted_segment.length_of_a_bit.simplify();
		segment_event_sources_.emplace_back(length_adjusted_segment);
	}
}